

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O1

wchar_t node__delete(EditLine *el,keymacro_node_t **inptr,wchar_t *str)

{
  EditLine *pEVar1;
  wchar_t wVar2;
  EditLine *pEVar3;
  EditLine *el_00;
  EditLine *pEVar4;
  
  pEVar3 = (EditLine *)el->el_prog;
  pEVar1 = pEVar3;
  if (*(int *)&pEVar3->el_prog == *(int *)inptr) {
    pEVar4 = (EditLine *)0x0;
    el_00 = pEVar3;
  }
  else {
    do {
      pEVar4 = pEVar1;
      pEVar1 = (EditLine *)pEVar4->el_errfile;
      if (pEVar1 == (EditLine *)0x0) {
        pEVar4 = (EditLine *)0x0;
        el_00 = pEVar3;
        break;
      }
      el_00 = pEVar1;
    } while (*(int *)&pEVar1->el_prog != *(int *)inptr);
    if (pEVar1 == (EditLine *)0x0) {
      return L'\0';
    }
  }
  if (*(int *)((long)inptr + 4) != 0) {
    if (el_00->el_outfile == (FILE_conflict *)0x0) {
      return L'\0';
    }
    inptr = (keymacro_node_t **)((long)inptr + 4);
    wVar2 = node__delete((EditLine *)&el_00->el_outfile,inptr,str);
    if (wVar2 == L'\0') {
      return L'\0';
    }
    if (el_00->el_outfile != (FILE_conflict *)0x0) {
      return L'\0';
    }
  }
  pEVar3 = (EditLine *)&pEVar4->el_errfile;
  if (pEVar4 == (EditLine *)0x0) {
    pEVar3 = el;
  }
  pEVar3->el_prog = &el_00->el_errfile->_flags;
  el_00->el_errfile = (FILE_conflict *)0x0;
  node__put(el_00,(keymacro_node_t *)inptr);
  return L'\x01';
}

Assistant:

static int
node__delete(EditLine *el, keymacro_node_t **inptr, const wchar_t *str)
{
	keymacro_node_t *ptr;
	keymacro_node_t *prev_ptr = NULL;

	ptr = *inptr;

	if (ptr->ch != *str) {
		keymacro_node_t *xm;

		for (xm = ptr; xm->sibling != NULL; xm = xm->sibling)
			if (xm->sibling->ch == *str)
				break;
		if (xm->sibling == NULL)
			return 0;
		prev_ptr = xm;
		ptr = xm->sibling;
	}
	if (*++str == '\0') {
		/* we're there */
		if (prev_ptr == NULL)
			*inptr = ptr->sibling;
		else
			prev_ptr->sibling = ptr->sibling;
		ptr->sibling = NULL;
		node__put(el, ptr);
		return 1;
	} else if (ptr->next != NULL &&
	    node__delete(el, &ptr->next, str) == 1) {
		if (ptr->next != NULL)
			return 0;
		if (prev_ptr == NULL)
			*inptr = ptr->sibling;
		else
			prev_ptr->sibling = ptr->sibling;
		ptr->sibling = NULL;
		node__put(el, ptr);
		return 1;
	} else {
		return 0;
	}
}